

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void propagatemark(global_State *g)

{
  lua_State *th_00;
  int iVar1;
  Proto *p;
  lua_State *th;
  CClosure *cl_1;
  LClosure *cl;
  Table *h;
  GCObject *o;
  lu_mem size;
  global_State *g_local;
  
  th_00 = (lua_State *)g->gray;
  th_00->marked = th_00->marked | 4;
  switch(th_00->tt) {
  case '\x05':
    g->gray = (GCObject *)th_00->stack_last;
    o = (GCObject *)traversetable(g,(Table *)th_00);
    break;
  case '\x06':
    g->gray = (GCObject *)th_00->top;
    o = (GCObject *)traverseLclosure(g,(LClosure *)th_00);
    break;
  default:
    return;
  case '\b':
    g->gray = th_00->gclist;
    th_00->gclist = g->grayagain;
    g->grayagain = (GCObject *)th_00;
    th_00->marked = th_00->marked & 0xfb;
    o = (GCObject *)traversethread(g,th_00);
    break;
  case '\t':
    g->gray = (GCObject *)(th_00->base_ci).previous;
    iVar1 = traverseproto(g,(Proto *)th_00);
    o = (GCObject *)(long)iVar1;
    break;
  case '&':
    g->gray = (GCObject *)th_00->top;
    o = (GCObject *)traverseCclosure(g,(CClosure *)th_00);
  }
  g->GCmemtrav = (long)&o->next + g->GCmemtrav;
  return;
}

Assistant:

static void propagatemark(global_State *g) {
    lu_mem size;
    GCObject *o = g->gray;
    lua_assert(isgray(o));
    gray2black(o);
    switch (o->tt) {
        case LUA_TTABLE: {
            Table *h = gco2t(o);
            g->gray = h->gclist;  /* remove from 'gray' list */
            size = traversetable(g, h);
            break;
        }
        case LUA_TLCL: {
            LClosure *cl = gco2lcl(o);
            g->gray = cl->gclist;  /* remove from 'gray' list */
            size = traverseLclosure(g, cl);
            break;
        }
        case LUA_TCCL: {
            CClosure *cl = gco2ccl(o);
            g->gray = cl->gclist;  /* remove from 'gray' list */
            size = traverseCclosure(g, cl);
            break;
        }
        case LUA_TTHREAD: {
            lua_State *th = gco2th(o);
            g->gray = th->gclist;  /* remove from 'gray' list */
            linkgclist(th, g->grayagain);  /* insert into 'grayagain' list */
            black2gray(o);
            size = traversethread(g, th);
            break;
        }
        case LUA_TPROTO: {
            Proto *p = gco2p(o);
            g->gray = p->gclist;  /* remove from 'gray' list */
            size = traverseproto(g, p);
            break;
        }
        default:
            lua_assert(0);
            return;
    }
    g->GCmemtrav += size;
}